

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect_subscriber.c
# Opt level: O1

void reconnect_client(mqtt_client *client,void **reconnect_state_vptr)

{
  undefined8 *puVar1;
  int socketfd;
  char *pcVar2;
  void *__dest;
  ulong __n;
  
  puVar1 = (undefined8 *)*reconnect_state_vptr;
  if (client->error != MQTT_ERROR_INITIAL_RECONNECT) {
    close(client->socketfd);
  }
  if (client->error != MQTT_ERROR_INITIAL_RECONNECT) {
    pcVar2 = mqtt_error_str(client->error);
    printf("reconnect_client: called while client was in error state \"%s\"\n",pcVar2);
  }
  pcVar2 = (char *)puVar1[1];
  socketfd = open_nb_socket((char *)*puVar1,pcVar2);
  if (socketfd != -1) {
    mqtt_reinit(client,socketfd,(uint8_t *)puVar1[3],puVar1[4],(uint8_t *)puVar1[5],puVar1[6]);
    mqtt_connect(client,(char *)0x0,(char *)0x0,(void *)0x0,0,(char *)0x0,(char *)0x0,'\x02',400);
    mqtt_subscribe(client,(char *)puVar1[2],0);
    return;
  }
  reconnect_client_cold_1();
  __n = (ulong)*(ushort *)(pcVar2 + 4);
  __dest = malloc(__n + 1);
  memcpy(__dest,*(void **)(pcVar2 + 8),__n);
  *(undefined1 *)((long)__dest + __n) = 0;
  printf("Received publish(\'%s\'): %s\n",__dest,*(undefined8 *)(pcVar2 + 0x18));
  free(__dest);
  return;
}

Assistant:

void reconnect_client(struct mqtt_client* client, void **reconnect_state_vptr)
{
    struct reconnect_state_t *reconnect_state = *((struct reconnect_state_t**) reconnect_state_vptr);

    /* Close the clients socket if this isn't the initial reconnect call */
    if (client->error != MQTT_ERROR_INITIAL_RECONNECT) {
        close(client->socketfd);
    }

    /* Perform error handling here. */
    if (client->error != MQTT_ERROR_INITIAL_RECONNECT) {
        printf("reconnect_client: called while client was in error state \"%s\"\n",
               mqtt_error_str(client->error)
        );
    }

    /* Open a new socket. */
    int sockfd = open_nb_socket(reconnect_state->hostname, reconnect_state->port);
    if (sockfd == -1) {
        perror("Failed to open socket: ");
        exit_example(EXIT_FAILURE, sockfd, NULL);
    }

    /* Reinitialize the client. */
    mqtt_reinit(client, sockfd,
                reconnect_state->sendbuf, reconnect_state->sendbufsz,
                reconnect_state->recvbuf, reconnect_state->recvbufsz
    );

    /* Create an anonymous session */
    const char* client_id = NULL;
    /* Ensure we have a clean session */
    uint8_t connect_flags = MQTT_CONNECT_CLEAN_SESSION;
    /* Send connection request to the broker. */
    mqtt_connect(client, client_id, NULL, NULL, 0, NULL, NULL, connect_flags, 400);

    /* Subscribe to the topic. */
    mqtt_subscribe(client, reconnect_state->topic, 0);
}